

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O1

MPP_RET mpp_buffer_group_get
                  (MppBufferGroup *group,MppBufferType type,MppBufferMode mode,char *tag,
                  char *caller)

{
  MPP_RET MVar1;
  ulong uVar2;
  
  uVar2 = (ulong)type & 0xffff;
  if ((((uint)uVar2 < 5) && (group != (MppBufferGroup *)0x0)) && ((int)mode < 2)) {
    MVar1 = mpp_buffer_group_init((MppBufferGroupImpl **)group,tag,caller,mode,type);
    return MVar1;
  }
  _mpp_log_l(2,"mpp_buffer","input invalid group %p mode %d type %d from %s\n",
             "mpp_buffer_group_get",group,(ulong)mode,(ulong)type,caller,uVar2);
  return MPP_ERR_UNKNOW;
}

Assistant:

MPP_RET mpp_buffer_group_get(MppBufferGroup *group, MppBufferType type, MppBufferMode mode,
                             const char *tag, const char *caller)
{
    if (NULL == group ||
        mode >= MPP_BUFFER_MODE_BUTT ||
        (type & MPP_BUFFER_TYPE_MASK) >= MPP_BUFFER_TYPE_BUTT) {
        mpp_err_f("input invalid group %p mode %d type %d from %s\n",
                  group, mode, type, caller);
        return MPP_ERR_UNKNOW;
    }

    return mpp_buffer_group_init((MppBufferGroupImpl**)group, tag, caller, mode, type);
}